

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O1

void test_shader_code_compilation(GLuint p_shader,ShaderType p_type)

{
  ostream *poVar1;
  size_t sVar2;
  GLint success;
  GLchar info_log [1024];
  int local_41c;
  GLchar local_418 [1024];
  
  (*glad_glGetShaderiv)(p_shader,0x8b81,&local_41c);
  if (local_41c == 0) {
    (*glad_glGetShaderInfoLog)(p_shader,0x400,(GLsizei *)0x0,local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"p_shader:",9);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," shader code compilation failed p_type:",0x27);
    poVar1 = operator<<(poVar1,p_type);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error:",6);
    sVar2 = strlen(local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_418,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  return;
}

Assistant:

void test_shader_code_compilation(
    const GLuint p_shader,
    const ShaderType p_type) noexcept
{
    static constexpr auto info_log_size = 1024;
    GLint success;
    GLchar info_log[info_log_size];
    glGetShaderiv(p_shader, GL_COMPILE_STATUS, &success);
    if (!success)
    {
        glGetShaderInfoLog(p_shader, info_log_size, nullptr, info_log);
        std::cerr << "p_shader:" << p_shader << " shader code compilation failed p_type:" << p_type << "\n";
        std::cerr << "error:" << info_log << "\n";
    }
}